

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O3

CURLcode cw_pause_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  void *pvVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  uint type_00;
  _Bool _Var4;
  _Bool _Var5;
  CURLcode CVar6;
  undefined8 *puVar7;
  bufq *q;
  size_t nwritten;
  uint local_54;
  size_t local_50;
  size_t local_48;
  uint local_3c;
  Curl_cwriter *local_38;
  
  pvVar1 = writer->ctx;
  local_38 = writer;
  _Var4 = Curl_cwriter_is_content_decoding(data);
  if (*(long *)((long)pvVar1 + 0x20) == 0) {
LAB_001239a7:
    _Var5 = Curl_cwriter_is_paused(data);
    if (!_Var5) {
      local_3c = type & 0xffffff7f;
      do {
        local_50 = 0x1000;
        if (blen < 0x1000) {
          local_50 = blen;
        }
        if ((_Var4 & (byte)type) == 0) {
          local_50 = blen;
        }
        type_00 = type;
        if (local_50 < blen) {
          type_00 = local_3c;
        }
        CVar6 = Curl_cwriter_write(data,local_38->next,type_00,buf,local_50);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"[PAUSE] writing %zu/%zu bytes of type %x -> %d",local_50,blen,
                         (ulong)type_00,(ulong)CVar6);
        }
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        blen = blen - local_50;
        if (blen == 0) {
          return CURLE_OK;
        }
        buf = buf + local_50;
      } while ((*(long *)((long)pvVar1 + 0x20) == 0) &&
              (_Var5 = Curl_cwriter_is_paused(data), !_Var5));
      goto LAB_001239c9;
    }
  }
  else {
    _Var5 = Curl_cwriter_is_paused(data);
    if ((!_Var5) && (CVar6 = cw_pause_flush(data,local_38), CVar6 != CURLE_OK)) {
      return CVar6;
    }
    if (*(long *)((long)pvVar1 + 0x20) == 0) goto LAB_001239a7;
  }
  local_50 = 0;
LAB_001239c9:
  while( true ) {
    local_54 = type & 1;
    local_48 = 0;
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    if (((lVar2 == 0) || (local_54 == 0)) || (*(int *)(lVar2 + 0x48) != type)) {
      puVar7 = (undefined8 *)(*Curl_ccalloc)(1,0x50);
      if (puVar7 == (undefined8 *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      q = (bufq *)(puVar7 + 1);
      *(int *)(puVar7 + 9) = type;
      if (local_54 == 0) {
        Curl_bufq_init(q,blen,1);
      }
      else {
        Curl_bufq_init2(q,0x4000,1,3);
      }
      *puVar7 = *(undefined8 *)((long)pvVar1 + 0x20);
      *(undefined8 **)((long)pvVar1 + 0x20) = puVar7;
    }
    else {
      q = (bufq *)(lVar2 + 8);
    }
    CVar6 = Curl_bufq_cwrite(q,buf,blen,&local_48);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"[PAUSE] buffer %zu more bytes of type %x, total=%zu -> %d",local_48,
                     (ulong)(uint)type,*(long *)((long)pvVar1 + 0x28) + local_50,(ulong)CVar6);
    }
    if (CVar6 != CURLE_OK) break;
    buf = buf + local_48;
    *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) + local_48;
    blen = blen - local_48;
    if (blen == 0) {
      return CURLE_OK;
    }
  }
  return CVar6;
}

Assistant:

static CURLcode cw_pause_write(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               const char *buf, size_t blen)
{
  struct cw_pause_ctx *ctx = writer->ctx;
  CURLcode result = CURLE_OK;
  size_t wlen = 0;
  bool decoding = Curl_cwriter_is_content_decoding(data);

  if(ctx->buf && !Curl_cwriter_is_paused(data)) {
    result = cw_pause_flush(data, writer);
    if(result)
      return result;
  }

  while(!ctx->buf && !Curl_cwriter_is_paused(data)) {
    int wtype = type;
    DEBUGASSERT(!ctx->buf);
    /* content decoding might blow up size considerably, write smaller
     * chunks to make pausing need buffer less. */
    wlen = (decoding && (type & CLIENTWRITE_BODY)) ?
           CURLMIN(blen, CW_PAUSE_DEC_WRITE_CHUNK) : blen;
    if(wlen < blen)
      wtype &= ~CLIENTWRITE_EOS;
    result = Curl_cwriter_write(data, writer->next, wtype, buf, wlen);
    CURL_TRC_WRITE(data, "[PAUSE] writing %zu/%zu bytes of type %x -> %d",
                   wlen, blen, wtype, result);
    if(result)
      return result;
    buf += wlen;
    blen -= wlen;
    if(!blen)
      return result;
  }

  do {
    size_t nwritten = 0;
    if(ctx->buf && (ctx->buf->type == type) && (type & CLIENTWRITE_BODY)) {
      /* same type and body, append to current buffer which has a soft
       * limit and should take everything up to OOM. */
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    else {
      /* Need a new buf, type changed */
      struct cw_pause_buf *cwbuf = cw_pause_buf_create(type, blen);
      if(!cwbuf)
        return CURLE_OUT_OF_MEMORY;
      cwbuf->next = ctx->buf;
      ctx->buf = cwbuf;
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    CURL_TRC_WRITE(data, "[PAUSE] buffer %zu more bytes of type %x, "
                   "total=%zu -> %d", nwritten, type, ctx->buf_total + wlen,
                   result);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
    ctx->buf_total += nwritten;
  } while(blen);

  return result;
}